

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toolbar.cpp
# Opt level: O0

void __thiscall QtMWidgets::ToolBarLayout::setLeftArrow(ToolBarLayout *this,NavigationArrow *a)

{
  QWidgetItem *this_00;
  NavigationArrow *a_local;
  ToolBarLayout *this_local;
  
  if ((this->left != (QWidgetItem *)0x0) && (this->left != (QWidgetItem *)0x0)) {
    (**(code **)(*(long *)this->left + 8))();
  }
  this_00 = (QWidgetItem *)operator_new(0x18);
  QWidgetItem::QWidgetItem(this_00,&a->super_QWidget);
  this->left = this_00;
  return;
}

Assistant:

void
ToolBarLayout::setLeftArrow( NavigationArrow * a )
{
	if( left )
		delete left;

	left = new QWidgetItem( a );
}